

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateDeviceOrModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *deviceOrModuleUpdate)

{
  _Bool _Var1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo;
  BUFFER_HANDLE deviceJsonBuffer_00;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  BUFFER_HANDLE responseBuffer;
  BUFFER_HANDLE deviceJsonBuffer;
  LOGGER_LOG l_3;
  IOTHUB_DEVICE_OR_MODULE *tempDeviceOrModuleInfo;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *deviceOrModuleUpdate_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if ((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
     (deviceOrModuleUpdate == (IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x67a,1,
                "Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if (deviceOrModuleUpdate->deviceId == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x681,1,"deviceId cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    _Var1 = isAuthTypeAllowed(deviceOrModuleUpdate->authMethod);
    if (_Var1) {
      deviceOrModuleInfo = (IOTHUB_DEVICE_OR_MODULE *)malloc(0xa0);
      if (deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x68e,1,
                    "Malloc failed for tempDeviceOrModuleInfo");
        }
        l._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
      }
      else {
        memset(deviceOrModuleInfo,0,0xa0);
        deviceOrModuleInfo->deviceId = deviceOrModuleUpdate->deviceId;
        deviceOrModuleInfo->primaryKey = deviceOrModuleUpdate->primaryKey;
        deviceOrModuleInfo->secondaryKey = deviceOrModuleUpdate->secondaryKey;
        deviceOrModuleInfo->authMethod = deviceOrModuleUpdate->authMethod;
        deviceOrModuleInfo->status = deviceOrModuleUpdate->status;
        deviceOrModuleInfo->moduleId = deviceOrModuleUpdate->moduleId;
        deviceOrModuleInfo->iotEdge_capable = (_Bool)(deviceOrModuleUpdate->iotEdge_capable & 1);
        deviceOrModuleInfo->managedBy = deviceOrModuleUpdate->managedBy;
        l_4 = (LOGGER_LOG)0x0;
        deviceJsonBuffer_00 = constructDeviceOrModuleJson(deviceOrModuleInfo);
        if (deviceJsonBuffer_00 == (BUFFER_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x6a2,1,"Json creation failed");
          }
          l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else {
          l_4 = (LOGGER_LOG)BUFFER_new();
          if ((BUFFER_HANDLE)l_4 == (BUFFER_HANDLE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x6a7,1,
                        "BUFFER_new failed for responseBuffer");
            }
            l._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
          }
          else {
            l._4_4_ = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_UPDATE,
                                          deviceOrModuleUpdate->deviceId,
                                          deviceOrModuleUpdate->moduleId,deviceJsonBuffer_00,0,
                                          (BUFFER_HANDLE)l_4);
            if ((l._4_4_ == IOTHUB_REGISTRYMANAGER_ERROR) &&
               (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x6ac,1,
                        "Failure sending HTTP request for update device");
            }
          }
        }
        if (deviceJsonBuffer_00 != (BUFFER_HANDLE)0x0) {
          BUFFER_delete(deviceJsonBuffer_00);
        }
        if (l_4 != (LOGGER_LOG)0x0) {
          BUFFER_delete((BUFFER_HANDLE)l_4);
        }
      }
      free(deviceOrModuleInfo);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_UpdateDeviceOrModule",0x686,1,
                  "Invalid authorization type specified");
      }
      l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateDeviceOrModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE* deviceOrModuleUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleUpdate == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        if (deviceOrModuleUpdate->deviceId == NULL)
        {
            LogError("deviceId cannot be NULL");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if (isAuthTypeAllowed(deviceOrModuleUpdate->authMethod) == false)
        {
            LogError("Invalid authorization type specified");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else
        {
            IOTHUB_DEVICE_OR_MODULE* tempDeviceOrModuleInfo;
            if ((tempDeviceOrModuleInfo = malloc(sizeof(IOTHUB_DEVICE_OR_MODULE))) == NULL)
            {
                LogError("Malloc failed for tempDeviceOrModuleInfo");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else
            {
                (void)memset(tempDeviceOrModuleInfo, 0, sizeof(IOTHUB_DEVICE_OR_MODULE));
                tempDeviceOrModuleInfo->deviceId = deviceOrModuleUpdate->deviceId;
                tempDeviceOrModuleInfo->primaryKey = deviceOrModuleUpdate->primaryKey;
                tempDeviceOrModuleInfo->secondaryKey = deviceOrModuleUpdate->secondaryKey;
                tempDeviceOrModuleInfo->authMethod = deviceOrModuleUpdate->authMethod;
                tempDeviceOrModuleInfo->status = deviceOrModuleUpdate->status;
                tempDeviceOrModuleInfo->moduleId = deviceOrModuleUpdate->moduleId;
                tempDeviceOrModuleInfo->iotEdge_capable = deviceOrModuleUpdate->iotEdge_capable;
                tempDeviceOrModuleInfo->managedBy = deviceOrModuleUpdate->managedBy;

                BUFFER_HANDLE deviceJsonBuffer = NULL;
                BUFFER_HANDLE responseBuffer = NULL;

                if ((deviceJsonBuffer = constructDeviceOrModuleJson(tempDeviceOrModuleInfo)) == NULL)
                {
                    LogError("Json creation failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                else if ((responseBuffer = BUFFER_new()) == NULL)
                {
                    LogError("BUFFER_new failed for responseBuffer");
                    result = IOTHUB_REGISTRYMANAGER_ERROR;
                }
                else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_UPDATE, deviceOrModuleUpdate->deviceId, deviceOrModuleUpdate->moduleId, deviceJsonBuffer, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
                {
                    LogError("Failure sending HTTP request for update device");
                }

                if (deviceJsonBuffer != NULL)
                {
                    BUFFER_delete(deviceJsonBuffer);
                }
                if (responseBuffer != NULL)
                {
                    BUFFER_delete(responseBuffer);
                }
            }
            free(tempDeviceOrModuleInfo);
        }
    }
    return result;

}